

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckd_alloc.c
# Opt level: O1

jmp_buf * ckd_set_jump(jmp_buf *env,int abort)

{
  jmp_buf *pa_Var1;
  
  if (abort != 0) {
    jmp_abort = 1;
  }
  pa_Var1 = ckd_target;
  ckd_target = env;
  return pa_Var1;
}

Assistant:

jmp_buf *
ckd_set_jump(jmp_buf *env, int abort)
{
    jmp_buf *old;

    if (abort)
        jmp_abort = 1;

    old = ckd_target;
    ckd_target = env;
    return old;
}